

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicInputCase8::Run(BasicInputCase8 *this)

{
  CallLogWrapper *this_00;
  Vec4 *pVVar1;
  long lVar2;
  GLuint i;
  GLuint index;
  GLfloat d [6];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  this_00 = &(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  index = 0;
  do {
    glu::CallLogWrapper::glVertexAttrib4f(this_00,index,0.0,0.0,0.0,0.0);
    index = index + 1;
  } while (index != 0x10);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x18,(void *)0x0,0x88e4);
  local_48 = 0x400000003f800000;
  uStack_40 = 0x4080000040400000;
  local_38 = 0x40c0000040a00000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0x18,&local_48);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x28,(void *)0x0,0x88e4);
  local_38 = 0xc0c00000c0a00000;
  uStack_30 = 0xc1000000c0e00000;
  local_48 = 0xc0000000bf800000;
  uStack_40 = 0xc0800000c0400000;
  local_28 = 0xc1200000c1100000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0x28,&local_48);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,3,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,1,3,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,2,1,0x1406,'\0',4);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,5,4,0x1406,'\0',0xc);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0xe,2,0x1406,'\0',8);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,1,1);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,1);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,5,0xf);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0xe,7);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[0],0,0xc);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_vbo[0],4,4);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,7,this->m_vbo[1],8,0x10);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0xf,this->m_vbo[1],0xc,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,5);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xe);
  (this->super_BasicInputBase).expected_data[0].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0].m_data[1] = 2.0;
  (this->super_BasicInputBase).expected_data[0].m_data[2] = 3.0;
  (this->super_BasicInputBase).expected_data[0].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[1].m_data[0] = 2.0;
  (this->super_BasicInputBase).expected_data[1].m_data[1] = 3.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[1].m_data[2] = 4.0;
  pVVar1[1].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[2].m_data[0] = 3.0;
  (this->super_BasicInputBase).expected_data[2].m_data[1] = 0.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[5].m_data[0] = -7.0;
  (this->super_BasicInputBase).expected_data[5].m_data[1] = -8.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[5].m_data[2] = -9.0;
  pVVar1[5].m_data[3] = -10.0;
  (this->super_BasicInputBase).expected_data[0xe].m_data[0] = -5.0;
  (this->super_BasicInputBase).expected_data[0xe].m_data[1] = -6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0xe].m_data[2] = 0.0;
  pVVar1[0xe].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[0] = 4.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[1] = 5.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x10].m_data[2] = 6.0;
  pVVar1[0x10].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[0] = 3.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[1] = 4.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x11].m_data[2] = 5.0;
  pVVar1[0x11].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[0] = 4.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[1] = 0.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x12].m_data[2] = 0.0;
  pVVar1[0x12].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x15].m_data[0] = -7.0;
  (this->super_BasicInputBase).expected_data[0x15].m_data[1] = -8.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x15].m_data[2] = -9.0;
  pVVar1[0x15].m_data[3] = -10.0;
  (this->super_BasicInputBase).expected_data[0x1e].m_data[0] = -9.0;
  (this->super_BasicInputBase).expected_data[0x1e].m_data[1] = -10.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x1e].m_data[2] = 0.0;
  pVVar1[0x1e].m_data[3] = 1.0;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, 6 * 4, NULL, GL_STATIC_DRAW);
		{
			GLfloat d[] = { 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 6.0f };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, 10 * 4, NULL, GL_STATIC_DRAW);
		{
			GLfloat d[] = { -1.0f, -2.0f, -3.0f, -4.0f, -5.0f, -6.0f, -7.0f, -8.0f, -9.0f, -10.0f };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 4);
		glVertexAttribFormat(5, 4, GL_FLOAT, GL_FALSE, 12);
		glVertexAttribFormat(14, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(1, 1);
		glVertexAttribBinding(2, 1);
		glVertexAttribBinding(5, 15);
		glVertexAttribBinding(14, 7);
		glBindVertexBuffer(0, m_vbo[0], 0, 12);
		glBindVertexBuffer(1, m_vbo[0], 4, 4);
		glBindVertexBuffer(7, m_vbo[1], 8, 16);
		glBindVertexBuffer(15, m_vbo[1], 12, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(5);
		glEnableVertexAttribArray(14);

		expected_data[0]	   = Vec4(1.0f, 2.0f, 3.0f, 1.0f);
		expected_data[1]	   = Vec4(2.0f, 3.0f, 4.0f, 1.0f);
		expected_data[2]	   = Vec4(3.0f, 0.0f, 0.0f, 1.0f);
		expected_data[5]	   = Vec4(-7.0f, -8.0f, -9.0f, -10.0f);
		expected_data[14]	  = Vec4(-5.0f, -6.0f, 0.0f, 1.0f);
		expected_data[0 + 16]  = Vec4(4.0f, 5.0f, 6.0f, 1.0f);
		expected_data[1 + 16]  = Vec4(3.0f, 4.0f, 5.0f, 1.0f);
		expected_data[2 + 16]  = Vec4(4.0f, 0.0f, 0.0f, 1.0f);
		expected_data[5 + 16]  = Vec4(-7.0f, -8.0f, -9.0f, -10.0f);
		expected_data[14 + 16] = Vec4(-9.0f, -10.0f, 0.0f, 1.0f);
		return BasicInputBase::Run();
	}